

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b1filter.cc
# Opt level: O3

void ProcessFile(ostream *OutFile,istream *InFile,char *name)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  pointer pcVar11;
  long lVar12;
  pointer pbVar13;
  pointer pbVar14;
  ulong uVar15;
  char cVar16;
  pointer pbVar17;
  uint uVar18;
  ulong uVar19;
  pointer pbVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  value_type local_58;
  ostream *local_38;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38 = OutFile;
LAB_001026d5:
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._M_string_length,0x103057);
  bVar6 = false;
  bVar5 = false;
LAB_001026ed:
  while( true ) {
    while( true ) {
      while( true ) {
        bVar3 = bVar5;
        bVar2 = bVar6;
        iVar7 = std::istream::get();
        cVar16 = (char)&local_58;
        bVar6 = bVar2;
        bVar5 = bVar3;
        if (0x25 < iVar7) break;
        if (iVar7 < 0xd) goto LAB_00102787;
        if (iVar7 != 0xd) {
          if (iVar7 != 0x22) goto LAB_001027a1;
          std::__cxx11::string::push_back(cVar16);
          bVar6 = !bVar2 && !bVar3;
        }
      }
      if (iVar7 == 0x3a) break;
      if (iVar7 == 0x27) {
        std::__cxx11::string::push_back(cVar16);
        bVar5 = !bVar3 && !bVar2;
      }
      else {
        if (iVar7 != 0x26) goto LAB_001027a1;
        if ((!bVar3 && !bVar2) && Extended == 0) goto LAB_001027de;
        bVar6 = false;
        bVar5 = false;
        if ((bVar3 || bVar2) || Extended == 0) goto LAB_001027f1;
      }
    }
    if (((bVar3) || (bVar2)) || (Extended != 0)) break;
LAB_001027de:
    std::__cxx11::string::append((char *)&local_58);
    bVar6 = false;
    bVar5 = false;
  }
  goto LAB_001027f1;
LAB_00102787:
  if (iVar7 == 0) goto LAB_001026ed;
  if (iVar7 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00102ad8;
    pbVar20 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_0010286f;
  }
  if (iVar7 == 10) goto LAB_00102825;
LAB_001027a1:
  if (!bVar3 && !bVar2) {
    toupper(iVar7);
    std::__cxx11::string::push_back(cVar16);
    bVar6 = false;
    bVar5 = false;
    goto LAB_001026ed;
  }
LAB_001027f1:
  std::__cxx11::string::push_back(cVar16);
  bVar6 = bVar2;
  bVar5 = bVar3;
  goto LAB_001026ed;
LAB_0010286f:
  if (pbVar20->_M_string_length != 0) {
    uVar15 = 0;
    do {
      iVar7 = (int)uVar15;
      uVar19 = (ulong)iVar7;
      lVar12 = 0;
      do {
        __s = *(char **)((long)reserved + lVar12);
        sVar9 = strlen(__s);
        if ((pbVar20->_M_dataplus)._M_p[uVar19] == *__s) {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)pbVar20);
          iVar8 = std::__cxx11::string::compare((char *)&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          if (iVar8 == 0) {
            pcVar11 = (pbVar20->_M_dataplus)._M_p;
            if (0 < iVar7) {
              bVar1 = pcVar11[uVar15 - 1];
              iVar8 = isspace((int)(char)bVar1);
              if ((iVar8 == 0) &&
                 ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))))
              {
                std::__cxx11::string::replace((ulong)pbVar20,uVar19,(char *)0x0,0x103056);
                uVar15 = (ulong)(iVar7 + 1);
                pcVar11 = (pbVar20->_M_dataplus)._M_p;
              }
            }
            iVar7 = (int)uVar15;
            uVar18 = iVar7 + (int)sVar9;
            uVar15 = (ulong)uVar18;
            bVar1 = pcVar11[(int)uVar18];
            iVar8 = isspace((int)(char)bVar1);
            if ((iVar8 == 0) &&
               ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
              std::__cxx11::string::replace((ulong)pbVar20,(long)(int)uVar18,(char *)0x0,0x103056);
              uVar15 = (ulong)(iVar7 + (int)sVar9 + 1);
            }
            goto LAB_001029ee;
          }
        }
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x108);
      cVar16 = (pbVar20->_M_dataplus)._M_p[uVar19];
      uVar15 = (ulong)(iVar7 + 1);
      if (cVar16 == '\"') {
        uVar15 = 0x22;
LAB_001029dd:
        iVar7 = std::__cxx11::string::find((char)pbVar20,uVar15);
        if (iVar7 == -1) {
          std::__cxx11::string::push_back((char)pbVar20);
          break;
        }
        uVar15 = (ulong)(iVar7 + 1);
      }
      else if (cVar16 == '\'') {
        uVar15 = 0x27;
        goto LAB_001029dd;
      }
LAB_001029ee:
    } while ((ulong)(long)(int)uVar15 < pbVar20->_M_string_length);
  }
  pbVar20 = pbVar20 + 1;
  if (pbVar20 ==
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar20) {
      bVar6 = true;
      pbVar14 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar17 = (pointer)0x0;
      do {
        pbVar13 = pbVar14;
        if ((!bVar6) && ((int)*(pbVar13->_M_dataplus)._M_p - 0x3aU < 0xfffffff6)) {
          std::__cxx11::string::append((char *)pbVar17);
          pbVar20 = local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar6 = false;
        pbVar14 = pbVar13 + 1;
        pbVar17 = pbVar13;
      } while (pbVar13 + 1 != pbVar20);
    }
    poVar4 = local_38;
    pbVar14 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar20) {
      do {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 !=
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_00102ad8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    return;
  }
  goto LAB_0010286f;
LAB_00102825:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,&local_58);
  goto LAB_001026d5;
}

Assistant:

static void ProcessFile(
	std::ostream* OutFile,	//!< Output stream
	std::istream* InFile,	//!< Inout stream
	const char* name	//!< File name
)
{
//	std::cout << "Processing  " << name << std::endl;

	std::vector<std::string> source;

	LoadFile(InFile, source);
	MungFile(source);
	Writefile(OutFile, source);
}